

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool __thiscall cmState::GetGlobalPropertyAsBool(cmState *this,string *prop)

{
  bool bVar1;
  cmValue unaff_retaddr;
  
  GetGlobalProperty(this,prop);
  bVar1 = cmIsOn(unaff_retaddr);
  return bVar1;
}

Assistant:

bool cmState::GetGlobalPropertyAsBool(const std::string& prop)
{
  return cmIsOn(this->GetGlobalProperty(prop));
}